

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPInReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPInReductionClause *this)

{
  string clause_string;
  allocator<char> local_50 [8];
  ulong local_48;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"in_reduction ",local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"(",(allocator<char> *)&local_30);
  switch(this->identifier) {
  case OMPC_IN_REDUCTION_IDENTIFIER_plus:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_minus:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_mul:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logand:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logor:
    break;
  default:
    goto switchD_0015cb24_caseD_8;
  case OMPC_IN_REDUCTION_IDENTIFIER_max:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_min:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_user:
    std::__cxx11::string::string((string *)&local_30,(string *)&this->user_defined_identifier);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_30);
    goto switchD_0015cb24_caseD_8;
  }
  std::__cxx11::string::append((char *)local_50);
switchD_0015cb24_caseD_8:
  if (1 < local_48) {
    std::__cxx11::string::append((char *)local_50);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_30,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)local_50);
  if (3 < local_48) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPInReductionClause::toString() {

    std::string result = "in_reduction ";
    std::string clause_string = "(";
    OpenMPInReductionClauseIdentifier identifier = this->getIdentifier();
    switch (identifier) {
        case OMPC_IN_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}